

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O2

int long_comp(void *v1,void *v2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*v2 <= *v1) {
    uVar1 = (uint)(*v2 < *v1);
  }
  return uVar1;
}

Assistant:

int long_comp(const void *v1, const void *v2) {
  long l1 = *(long *)v1, l2 = *(long *)v2;
  if (l1 < l2)
    return -1;
  if (l1 > l2)
    return 1;
  return 0;
}